

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_set_shader_value_v
               (rf_shader shader,int uniform_loc,void *value,int uniform_name,int count)

{
  _func_void_int_int_float_ptr *UNRECOVERED_JUMPTABLE;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(shader.id);
  switch(uniform_name) {
  case 0:
    UNRECOVERED_JUMPTABLE = (rf__ctx->field_0).gfx_ctx.gl.Uniform1fv;
    break;
  case 1:
    UNRECOVERED_JUMPTABLE = (rf__ctx->field_0).gfx_ctx.gl.Uniform2fv;
    break;
  case 2:
    UNRECOVERED_JUMPTABLE = (rf__ctx->field_0).gfx_ctx.gl.Uniform3fv;
    break;
  case 3:
    UNRECOVERED_JUMPTABLE = (rf__ctx->field_0).gfx_ctx.gl.Uniform4fv;
    break;
  case 4:
  case 8:
    UNRECOVERED_JUMPTABLE = (_func_void_int_int_float_ptr *)(rf__ctx->field_0).gfx_ctx.gl.Uniform1iv
    ;
    break;
  case 5:
    UNRECOVERED_JUMPTABLE = (_func_void_int_int_float_ptr *)(rf__ctx->field_0).gfx_ctx.gl.Uniform2iv
    ;
    break;
  case 6:
    UNRECOVERED_JUMPTABLE = (_func_void_int_int_float_ptr *)(rf__ctx->field_0).gfx_ctx.gl.Uniform3iv
    ;
    break;
  case 7:
    UNRECOVERED_JUMPTABLE = (_func_void_int_int_float_ptr *)(rf__ctx->field_0).gfx_ctx.gl.Uniform4iv
    ;
    break;
  default:
    rf_log_impl(4,0x17c2c5);
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(uniform_loc,count,(float *)value);
  return;
}

Assistant:

RF_API void rf_gfx_set_shader_value_v(rf_shader shader, int uniform_loc, const void* value, int uniform_name, int count)
{
    rf_gl.UseProgram(shader.id);

    switch (uniform_name)
    {
        case RF_UNIFORM_FLOAT: rf_gl.Uniform1fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_VEC2: rf_gl.Uniform2fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_VEC3: rf_gl.Uniform3fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_VEC4: rf_gl.Uniform4fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_INT: rf_gl.Uniform1iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_IVEC2: rf_gl.Uniform2iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_IVEC3: rf_gl.Uniform3iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_IVEC4: rf_gl.Uniform4iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_SAMPLER2D: rf_gl.Uniform1iv(uniform_loc, count, (int* )value); break;
        default: RF_LOG(RF_LOG_TYPE_WARNING, "rf_shader uniform could not be set data type not recognized");
    }

    //rf_gl.UseProgram(0);      // Avoid reseting current shader program, in case other uniforms are set
}